

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall tcu::TextureCube::allocLevel(TextureCube *this,CubeFace face,int levelNdx)

{
  int iVar1;
  reference pvVar2;
  void *data;
  reference __dest;
  PixelBufferAccess local_48;
  int local_20;
  int local_1c;
  int dataSize;
  int size;
  int levelNdx_local;
  CubeFace face_local;
  TextureCube *this_local;
  
  dataSize = levelNdx;
  size = face;
  _levelNdx_local = this;
  local_1c = getMipPyramidLevelSize(this->m_size,levelNdx);
  iVar1 = TextureFormat::getPixelSize(&this->m_format);
  local_20 = iVar1 * local_1c * local_1c;
  pvVar2 = std::
           vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
           ::operator[](this->m_data + (uint)size,(long)dataSize);
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage(pvVar2,(long)local_20);
  iVar1 = local_1c;
  pvVar2 = std::
           vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
           ::operator[](this->m_data + (uint)size,(long)dataSize);
  data = de::ArrayBuffer<unsigned_char,_1UL,_1UL>::getPtr(pvVar2);
  PixelBufferAccess::PixelBufferAccess(&local_48,&this->m_format,iVar1,iVar1,1,data);
  __dest = std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::operator[]
                     (this->m_access + (uint)size,(long)dataSize);
  memcpy(__dest,&local_48,0x28);
  return;
}

Assistant:

void TextureCube::allocLevel (tcu::CubeFace face, int levelNdx)
{
	const int	size		= getMipPyramidLevelSize(m_size, levelNdx);
	const int	dataSize	= m_format.getPixelSize()*size*size;
	DE_ASSERT(isLevelEmpty(face, levelNdx));

	m_data[face][levelNdx].setStorage(dataSize);
	m_access[face][levelNdx] = PixelBufferAccess(m_format, size, size, 1, m_data[face][levelNdx].getPtr());
}